

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::BufferedOutputStream_&> __thiscall
kj::dynamicDowncastIfAvailable<kj::BufferedOutputStream,kj::OutputStream>
          (kj *this,OutputStream *from)

{
  BufferedOutputStream *local_38;
  OutputStream *from_local;
  
  if (from == (OutputStream *)0x0) {
    local_38 = (BufferedOutputStream *)0x0;
  }
  else {
    local_38 = (BufferedOutputStream *)
               __dynamic_cast(from,&OutputStream::typeinfo,&BufferedOutputStream::typeinfo,0);
  }
  Maybe<kj::BufferedOutputStream_&>::Maybe((Maybe<kj::BufferedOutputStream_&> *)this,local_38);
  return (Maybe<kj::BufferedOutputStream_&>)(BufferedOutputStream *)this;
}

Assistant:

Maybe<To&> dynamicDowncastIfAvailable(From& from) {
  // If RTTI is disabled, always returns kj::none.  Otherwise, works like dynamic_cast.  Useful
  // in situations where dynamic_cast could allow an optimization, but isn't strictly necessary
  // for correctness.  It is highly recommended that you try to arrange all your dynamic_casts
  // this way, as a dynamic_cast that is necessary for correctness implies a flaw in the interface
  // design.

  // Force a compile error if To is not a subtype of From.  Cross-casting is rare; if it is needed
  // we should have a separate cast function like dynamicCrosscastIfAvailable().
  if (false) {
    kj::implicitCast<From*>(kj::implicitCast<To*>(nullptr));
  }

#if KJ_NO_RTTI
  return kj::none;
#else
  return dynamic_cast<To*>(&from);
#endif
}